

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.hpp
# Opt level: O2

SignaturesVector * __thiscall
Diligent::SerializedPipelineStateImpl::GetSignatures(SerializedPipelineStateImpl *this)

{
  char (*in_R8) [68];
  string msg;
  string local_30;
  
  if ((this->m_Status)._M_i != PIPELINE_STATE_STATUS_READY) {
    FormatString<char[17],char_const*,char[68]>
              (&local_30,(Diligent *)"Pipeline state \'",(char (*) [17])&this->m_Desc,
               (char **)"\' is not ready. Use GetStatus() to check the pipeline state status.",in_R8
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/include/SerializedPipelineStateImpl.hpp"
               ,0xa1);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return &this->m_Signatures;
}

Assistant:

const SignaturesVector& GetSignatures()
    {
        DEV_CHECK_ERR(m_Status.load() == PIPELINE_STATE_STATUS_READY, "Pipeline state '", m_Desc.Name, "' is not ready. Use GetStatus() to check the pipeline state status.");
        return m_Signatures;
    }